

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypspur-interpreter.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  int coordinate;
  double th;
  double y;
  double x;
  char text [16];
  char ip [64];
  option options [9];
  int local_1e4;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  undefined1 local_1c0 [8];
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [8];
  char local_1a8 [16];
  char local_198 [64];
  undefined1 local_158 [296];
  
  local_1e4 = 4;
  memcpy(local_158,&PTR_anon_var_dwarf_233_00107c90,0x120);
  hook_pre_global();
  bVar4 = true;
  local_1c8 = 0.0;
  local_1d0 = 0.0;
  local_1d8 = 0.0;
  local_1e0 = 0.0;
  bVar2 = false;
  bVar1 = false;
  bVar3 = false;
  iVar6 = 0;
  iVar7 = 0;
  while( true ) {
    while( true ) {
      while (iVar5 = getopt_long(argc,argv,"V:W:A:O:c:q:s:h",local_158,0), 0x56 < iVar5) {
        if (iVar5 < 0x68) {
          if (iVar5 == 0x57) {
            local_1d0 = atof(_optarg);
            bVar1 = true;
          }
          else if (iVar5 == 99) {
            if (iVar6 == 0) {
              YPSpur_init();
            }
            else if (iVar6 == -1) {
              YPSpur_init_socket(local_198,iVar7);
            }
            else {
              YPSpur_initex();
            }
            proc_spur(_optarg,&local_1e4);
            return 1;
          }
        }
        else if (iVar5 == 0x71) {
          iVar6 = atoi(_optarg);
        }
        else if (iVar5 == 0x73) {
          strncpy(local_198,_optarg,0x40);
          pcVar9 = strchr(local_198,0x3a);
          if (pcVar9 == (char *)0x0) {
            main_cold_1();
            return -1;
          }
          *pcVar9 = '\0';
          iVar7 = atoi(pcVar9 + 1);
          iVar6 = -1;
        }
        else if (iVar5 == 0x68) {
          print_help(argv);
          return 1;
        }
      }
      if (iVar5 < 0x4f) break;
      if (iVar5 == 0x4f) {
        local_1e0 = atof(_optarg);
        bVar3 = true;
      }
      else if (iVar5 == 0x56) {
        local_1c8 = atof(_optarg);
        bVar4 = false;
      }
    }
    if (iVar5 == -1) break;
    if (iVar5 == 0x41) {
      local_1d8 = atof(_optarg);
      bVar2 = true;
    }
  }
  signal(2,ctrlc);
  if (iVar6 == -1) {
    YPSpur_init_socket(local_198,iVar7);
  }
  else if (iVar6 == 0) {
    YPSpur_init();
  }
  else {
    YPSpur_initex();
  }
  if (!bVar4) {
    YPSpur_set_vel(local_1c8);
  }
  if (bVar1) {
    YPSpur_set_angvel(local_1d0);
  }
  if (bVar2) {
    YPSpur_set_accel(local_1d8);
  }
  if (bVar3) {
    YPSpur_set_angaccel(local_1e0);
  }
  using_history();
  read_history(".spurip_history");
  bVar11 = false;
  bVar10 = true;
  do {
    while (iVar5 = __sigsetjmp(ctrlc_capture,1), iVar5 != 0) {
      write_history(".spurip_history");
    }
    YPSpur_get_pos(2,local_1b0,local_1b8,local_1c0);
    iVar5 = YP_get_error_state();
    if (iVar5 == 0) {
      if (bVar11) {
        main_cold_3();
      }
      snprintf(local_1a8,0x10,"%s> ",YPSpur_CSName + local_1e4);
      main::line_prev = main::line;
      pcVar9 = (char *)readline(local_1a8);
      main::line = pcVar9;
      if (pcVar9 == (char *)0x0) {
LAB_001033a6:
        putchar(10);
        write_history(".spurip_history");
        return 0;
      }
      if ((*pcVar9 != '\0') &&
         ((main::line_prev == (char *)0x0 || (iVar8 = strcmp(pcVar9,main::line_prev), iVar8 != 0))))
      {
        add_history(pcVar9);
      }
      iVar8 = proc_spur(main::line,&local_1e4);
      if (main::line_prev != (char *)0x0) {
        free(main::line_prev);
      }
      if (iVar8 < 0) goto LAB_001033a6;
    }
    else {
      if (iVar6 == -1) {
        YPSpur_init_socket(local_198,iVar7);
      }
      else if (iVar6 == 0) {
        YPSpur_init();
      }
      else {
        YPSpur_initex();
      }
      if (!bVar4) {
        YPSpur_set_vel(local_1c8);
      }
      if (bVar1) {
        YPSpur_set_angvel(local_1d0);
      }
      if (bVar2) {
        YPSpur_set_accel(local_1d8);
      }
      if (bVar3) {
        YPSpur_set_angaccel(local_1e0);
      }
      if (bVar10) {
        main_cold_2();
      }
      yp_usleep(50000);
    }
    bVar11 = iVar5 != 0;
    bVar10 = iVar5 == 0;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
  int coordinate = CS_FS;
  char ip[64];
  int port = 0;
  int active = 1;
  int err = 0;
  double vel = 0;
  double angvel = 0;
  double accel = 0;
  double angaccel = 0;
  int set_vel = 0;
  int set_accel = 0;
  int set_angvel = 0;
  int set_angaccel = 0;
  int msqid = 0;
  struct option options[9] =
      {
          {"set-vel", 1, 0, 'V'},
          {"set-angvel", 1, 0, 'W'},
          {"set-accel", 1, 0, 'A'},
          {"set-angaccel", 1, 0, 'O'},
          {"command", 1, 0, 'c'},
          {"msq-id", 1, 0, 'q'},
          {"socket", 1, 0, 's'},
          {"help", 0, 0, 'h'},
          {0, 0, 0, 0}};
  int opt;

  hook_pre_global();

  while ((opt = getopt_long(argc, argv, "V:W:A:O:c:q:s:h", options, NULL)) != -1)
  {
    switch (opt)
    {
      case 'V':
        vel = atof(optarg);
        set_vel = 1;
        break;
      case 'W':
        angvel = atof(optarg);
        set_angvel = 1;
        break;
      case 'A':
        accel = atof(optarg);
        set_accel = 1;
        break;
      case 'O':
        angaccel = atof(optarg);
        set_angaccel = 1;
        break;
      case 'c':
        if (msqid == -1)
          YPSpur_init_socket(ip, port);
        else if (msqid == 0)
          YPSpur_init();
        else
          YPSpur_initex(msqid);
        proc_spur(optarg, &coordinate);
        return 1;
        break;
      case 'q':
        msqid = atoi(optarg);
        break;
      case 's':
        strncpy(ip, optarg, 64);
        {
          char* p;
          p = strchr(ip, ':');
          if (p == NULL)
          {
            fprintf(stderr, "USAGE: %s -s ip:port\n", argv[0]);
            return -1;
          }
          *p = 0;
          port = atoi(p + 1);
          msqid = -1;
        }
        break;
      case 'h':
        print_help(argv);
        return 1;
        break;
      default:
        break;
    }
  }

#if HAVE_SIGLONGJMP
  signal(SIGINT, ctrlc);
#endif  // HAVE_SIGLONGJMP

  if (msqid == -1)
    YPSpur_init_socket(ip, port);
  else if (msqid == 0)
    YPSpur_init();
  else
    YPSpur_initex(msqid);

  if (set_vel)
    YPSpur_set_vel(vel);
  if (set_angvel)
    YPSpur_set_angvel(angvel);
  if (set_accel)
    YPSpur_set_accel(accel);
  if (set_angaccel)
    YPSpur_set_angaccel(angaccel);

#if HAVE_LIBREADLINE
  using_history();
  read_history(".spurip_history");
#endif  // HAVE_LIBREADLINE
  while (active)
  {
    static char* line = NULL;
    static char* line_prev = NULL;
    char text[16];
#if !HAVE_LIBREADLINE
#if HAVE_GETLINE
    size_t len;
#endif  // HAVE_GETLINE
#endif  // !HAVE_LIBREADLINE
#if HAVE_SIGLONGJMP
    if (sigsetjmp(ctrlc_capture, 1) != 0)
    {
#if HAVE_LIBREADLINE
      write_history(".spurip_history");
#endif  // HAVE_LIBREADLINE
    }
    else
#endif  // HAVE_SIGLONGJMP
    {
      {
        // Dummy for error checking
        double x, y, th;
        YPSpur_get_pos(CS_GL, &x, &y, &th);
      }
      if (YP_get_error_state())
      {
        if (msqid == -1)
          YPSpur_init_socket(ip, port);
        else if (msqid == 0)
          YPSpur_init();
        else
          YPSpur_initex(msqid);
        if (set_vel)
          YPSpur_set_vel(vel);
        if (set_angvel)
          YPSpur_set_angvel(angvel);
        if (set_accel)
          YPSpur_set_accel(accel);
        if (set_angaccel)
          YPSpur_set_angaccel(angaccel);
        if (err == 0)
        {
          fprintf(stderr, "WARN: YPSpur-coordinator terminated.\n");
          fflush(stderr);
#if HAVE_SIGLONGJMP
          signal(SIGINT, NULL);
#endif  // HAVE_SIGLONGJMP
        }
        err = 1;
        yp_usleep(50000);
        continue;
      }
      else
      {
        if (err == 1)
        {
          fprintf(stderr, "INFO: YPSpur-coordinator started.\n");
          fflush(stderr);
#if HAVE_SIGLONGJMP
          signal(SIGINT, ctrlc);
#endif  // HAVE_SIGLONGJMP
        }
      }
      err = 0;

      snprintf(text, sizeof(text), "%s> ", YPSpur_CSName[coordinate]);
#if HAVE_LIBREADLINE
      line_prev = line;
      line = readline(text);
      if (!line)
      {
        // EOF
        break;
      }
      if (strlen(line) > 0)
      {
        if (line && line_prev)
        {
          if (strcmp(line, line_prev) != 0)
          {
            add_history(line);
          }
        }
        else
        {
          add_history(line);
        }
      }
#else
      printf("%s", text);
      fflush(stdout);
      line = NULL;
#if HAVE_GETLINE
      len = 0;
      getline(&line, &len, stdin);
      if (len == 0)
        continue;
#else
      line = malloc(512);
      fgets(line, 512, stdin);
#endif  // HAVE_GETLINE
      line_prev = line;
#endif  // HAVE_LIBREADLINE
      if (proc_spur(line, &coordinate) < 0)
      {
        active = 0;
      }

      if (line_prev)
        free(line_prev);
    }
  }
  printf("\n");
#if HAVE_LIBREADLINE
  write_history(".spurip_history");
#endif  // HAVE_LIBREADLINE

  return 0;
}